

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::DiagScopeVariablesWalker::DiagScopeVariablesWalker
          (DiagScopeVariablesWalker *this,DiagStackFrame *_pFrame,Var _instance,
          IDiagObjectModelWalkerBase *innerWalker)

{
  uint32 uVar1;
  ScriptContext *scriptContext_00;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  ArenaAllocator *arena;
  ScriptContext *scriptContext;
  IDiagObjectModelWalkerBase *innerWalker_local;
  Var _instance_local;
  DiagStackFrame *_pFrame_local;
  DiagScopeVariablesWalker *this_local;
  
  scriptContext = (ScriptContext *)innerWalker;
  innerWalker_local = (IDiagObjectModelWalkerBase *)_instance;
  _instance_local = _pFrame;
  _pFrame_local = (DiagStackFrame *)this;
  VariableWalkerBase::VariableWalkerBase
            (&this->super_VariableWalkerBase,_pFrame,_instance,UIGroupType_InnerScope,false,false);
  (this->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase
       = (_func_int **)&PTR_Get_01dea6a8;
  this->pDiagScopeObjects =
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->diagScopeVarCount = 0;
  this->scopeIsInitialized = false;
  this->enumWithScopeAlso = false;
  scriptContext_00 = (ScriptContext *)(**(code **)(*_instance_local + 0x50))();
  alloc = GetArenaFromContext(scriptContext_00);
  pLVar2 = JsUtil::
           List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::New(alloc,4);
  this->pDiagScopeObjects = pLVar2;
  JsUtil::
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&scriptContext);
  uVar1 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[1])();
  this->diagScopeVarCount = uVar1;
  this->scopeIsInitialized = true;
  return;
}

Assistant:

DiagScopeVariablesWalker::DiagScopeVariablesWalker(DiagStackFrame* _pFrame, Var _instance, IDiagObjectModelWalkerBase* innerWalker)
        : VariableWalkerBase(_pFrame, _instance, UIGroupType_InnerScope, /* allowLexicalThis */ false),
        pDiagScopeObjects(nullptr),
        diagScopeVarCount(0),
        scopeIsInitialized(false), // false until end of method
        enumWithScopeAlso(false)
    {
        ScriptContext * scriptContext = _pFrame->GetScriptContext();
        ArenaAllocator *arena = GetArenaFromContext(scriptContext);
        pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);
        pDiagScopeObjects->Add(innerWalker);
        diagScopeVarCount = innerWalker->GetChildrenCount();
        scopeIsInitialized = true;
    }